

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O2

void __thiscall MipTimer::reportMipLevel1Clock(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  initializer_list<int> __l;
  allocator_type local_69;
  _Vector_base<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> mip_clock_list;
  int local_38 [8];
  
  local_38[4] = 8;
  local_38[5] = 9;
  local_38[6] = 10;
  local_38[7] = 3;
  local_38[0] = 4;
  local_38[1] = 5;
  local_38[2] = 6;
  local_38[3] = 7;
  __l._M_len = 8;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector(&mip_clock_list,__l,&local_69);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_68,&mip_clock_list);
  reportMipClockList(this,"MipLevl1",(vector<int,_std::allocator<int>_> *)&local_68,mip_timer_clock,
                     0,0.1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&mip_clock_list.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void reportMipLevel1Clock(const HighsTimerClock& mip_timer_clock) {
    const std::vector<HighsInt> mip_clock_list{kMipClockInit,
                                               kMipClockRunPresolve,
                                               kMipClockRunSetup,
                                               kMipClockTrivialHeuristics,
                                               kMipClockEvaluateRootNode,
                                               kMipClockPerformAging0,
                                               kMipClockSearch,
                                               kMipClockPostsolve};
    reportMipClockList("MipLevl1", mip_clock_list, mip_timer_clock,
                       kMipClockTotal, tolerance_percent_report);
  }